

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_exts.c
# Opt level: O3

LY_ERR lyplg_ext_compile_extension_instance
                 (lysc_ctx *ctx,lysp_ext_instance *extp,lysc_ext_instance *ext)

{
  int *piVar1;
  ly_stmt lVar2;
  lysp_ext_substmt *plVar3;
  lysc_ext_substmt *plVar4;
  lysp_type *type_p;
  lysp_when *when_p;
  lysp_restr *plVar5;
  lysc_when *plVar6;
  void *pvVar7;
  char *pcVar8;
  lysc_ext_substmt *plVar9;
  ly_bool lVar10;
  uint16_t uVar11;
  ushort uVar12;
  LY_ERR LVar13;
  void ***pppvVar14;
  lysc_node *node;
  long *plVar15;
  void **ppvVar16;
  void **ppvVar17;
  lysc_ext_substmt *plVar18;
  void **ppvVar19;
  ly_ctx *plVar20;
  char *pcVar21;
  char *pcVar22;
  lysp_node *pnode;
  lysp_ext_instance *plVar23;
  lysc_when **when_c;
  lysp_ext_instance *plVar24;
  LY_ERR LVar25;
  long lVar26;
  lysp_ext_instance *extp_00;
  lysp_restr *must_p;
  void **ppvVar27;
  ly_bool enabled;
  undefined7 uStack_5f;
  ly_set storagep_compiled;
  char *local_38;
  
  storagep_compiled.size = 0;
  storagep_compiled.count = 0;
  storagep_compiled.field_2.dnodes = (lyd_node **)0x0;
  if (ctx == (lysc_ctx *)0x0) {
    pcVar21 = "ctx";
    plVar20 = (ly_ctx *)0x0;
  }
  else if (extp == (lysp_ext_instance *)0x0) {
    plVar20 = ctx->ctx;
    pcVar21 = "extp";
  }
  else {
    if (ext != (lysc_ext_instance *)0x0) {
      ctx->ext = ext;
      ppvVar27 = (void **)0x0;
      while( true ) {
        plVar3 = extp->substmts;
        if (plVar3 == (lysp_ext_substmt *)0x0) {
          ppvVar16 = (void **)0x0;
        }
        else {
          ppvVar16 = plVar3[-1].storage_p;
        }
        if (ppvVar16 <= ppvVar27) break;
        ppvVar16 = plVar3[(long)ppvVar27].storage_p;
        if (*ppvVar16 != (void *)0x0) {
          lVar2 = plVar3[(long)ppvVar27].stmt;
          lVar10 = ly_set_contains(&storagep_compiled,ppvVar16,(uint32_t *)0x0);
          if (lVar10 == '\0') {
            plVar4 = ext->substmts;
            ppvVar17 = (void **)0xffffffffffffffff;
            plVar9 = plVar4;
            do {
              plVar18 = plVar9;
              if (plVar4 == (lysc_ext_substmt *)0x0) {
                ppvVar19 = (void **)0x0;
              }
              else {
                ppvVar19 = plVar4[-1].storage_p;
              }
              ppvVar17 = (void **)((long)ppvVar17 + 1);
              if (ppvVar19 <= ppvVar17) goto LAB_0019c813;
              plVar9 = plVar18 + 1;
            } while (lVar2 != plVar18->stmt);
            if ((lysp_qname *)*ppvVar16 == (lysp_qname *)0x0) {
              __assert_fail("*parsed_p",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_exts.c"
                            ,0x61,
                            "LY_ERR lys_compile_ext_instance_stmt(struct lysc_ctx *, void **, struct lysc_ext_instance *, struct lysc_ext_substmt *)"
                           );
            }
            LVar25 = LY_SUCCESS;
            if (lVar2 == LY_STMT_IF_FEATURE) {
              LVar13 = lys_eval_iffeatures(ctx->ctx,(lysp_qname *)*ppvVar16,&enabled);
              LVar25 = LY_SUCCESS;
              if (enabled == '\0') {
                LVar25 = LY_ENOT;
              }
              if (LVar13 != LY_SUCCESS) goto LAB_0019ccc3;
            }
            LVar13 = LVar25;
            when_c = (lysc_when **)plVar18->storage_p;
            if (when_c == (lysc_when **)0x0) goto LAB_0019c80a;
            lVar2 = plVar18->stmt;
            if ((int)lVar2 < 0x110000) {
              if ((int)lVar2 < 0x4000) {
                if ((int)lVar2 < 0x100) {
                  if ((lVar2 - LY_STMT_NOTIFICATION < 0x40) &&
                     ((0x800000008000808bU >> ((ulong)(lVar2 - LY_STMT_NOTIFICATION) & 0x3f) & 1) !=
                      0)) goto LAB_0019c348;
                  if (lVar2 == LY_STMT_AUGMENT) goto LAB_0019cc85;
                }
                else if ((int)lVar2 < 0x800) {
                  if (((lVar2 == LY_STMT_CASE) || (lVar2 == LY_STMT_CHOICE)) ||
                     (lVar2 == LY_STMT_CONTAINER)) {
LAB_0019c348:
                    plVar4 = ext->substmts;
                    pppvVar14 = &plVar4->storage_p;
                    ppvVar17 = (void **)0x0;
                    while( true ) {
                      if (plVar4 == (lysc_ext_substmt *)0x0) {
                        ppvVar19 = (void **)0x0;
                      }
                      else {
                        ppvVar19 = plVar4[-1].storage_p;
                      }
                      if (ppvVar19 <= ppvVar17) goto LAB_0019c412;
                      if (((lysc_ext_substmt *)(pppvVar14 + -1))->stmt == LY_STMT_STATUS) break;
                      ppvVar17 = (void **)((long)ppvVar17 + 1);
                      pppvVar14 = pppvVar14 + 2;
                    }
                    if (*pppvVar14 == (void **)0x0) {
LAB_0019c412:
                      uVar11 = 0;
                    }
                    else {
                      uVar11 = *(uint16_t *)*pppvVar14;
                    }
                    pnode = (lysp_node *)*ppvVar16;
                    if (pnode != (lysp_node *)0x0) {
                      do {
                        if ((pnode->nodetype & 0x3000) == 0) {
                          LVar13 = lys_compile_node(ctx,pnode,(lysc_node *)0x0,uVar11,(ly_set *)0x0)
                          ;
                        }
                        else {
                          node = (lysc_node *)calloc(1,0x60);
                          if (node == (lysc_node *)0x0) goto LAB_0019cba4;
                          LVar13 = lys_compile_node_action_inout(ctx,pnode,node);
                          if (LVar13 != LY_SUCCESS) goto LAB_0019ccc3;
                          LVar13 = lys_compile_node_connect(ctx,(lysc_node *)0x0,node);
                        }
                        if (LVar13 != LY_SUCCESS) goto LAB_0019ccc3;
                        pnode = pnode->next;
                      } while (pnode != (lysp_node *)0x0);
                      goto LAB_0019c813;
                    }
                    goto LAB_0019c80a;
                  }
                }
                else {
                  if ((lVar2 == LY_STMT_LEAF) || (lVar2 == LY_STMT_LEAF_LIST)) goto LAB_0019c348;
                  if (lVar2 == LY_STMT_GROUPING) goto LAB_0019cc85;
                }
              }
              else if ((int)lVar2 < 0x70000) {
                if ((int)lVar2 < 0x30000) {
                  if ((int)lVar2 < 0x10000) {
                    if ((lVar2 == LY_STMT_LIST) || (lVar2 == LY_STMT_USES)) goto LAB_0019c348;
                  }
                  else {
                    if (lVar2 == LY_STMT_ARGUMENT) goto LAB_0019c7f2;
                    if (lVar2 == LY_STMT_BASE) goto LAB_0019cc85;
                  }
                }
                else if ((int)lVar2 < 0x50000) {
                  if (lVar2 == LY_STMT_BIT) goto LAB_0019c843;
                  if (lVar2 == LY_STMT_BELONGS_TO) goto LAB_0019cc85;
                }
                else {
                  if (lVar2 == LY_STMT_CONFIG) {
                    if ((ctx->compile_opts & 4) == 0) {
                      if ((*(ushort *)ppvVar16 & 3) == 0) {
                        if ((ext->parent_stmt &
                            (LY_STMT_LIST|LY_STMT_LEAF_LIST|LY_STMT_LEAF|LY_STMT_CONTAINER|
                             LY_STMT_CHOICE|LY_STMT_CASE|LY_STMT_ANYXML|LY_STMT_ANYDATA)) ==
                            LY_STMT_NONE) {
                          uVar12 = 1;
                        }
                        else {
                          uVar12 = *(ushort *)((long)ext->parent + 2) & 3;
                        }
                      }
                      else {
                        uVar12 = *(ushort *)ppvVar16 | 0x800;
                      }
                      *(ushort *)when_c = uVar12;
                    }
                    goto LAB_0019c80a;
                  }
                  if (lVar2 == LY_STMT_CONTACT) goto LAB_0019c7f2;
                }
              }
              else if ((int)lVar2 < 0xc0000) {
                if ((int)lVar2 < 0x90000) {
                  if (lVar2 == LY_STMT_DESCRIPTION) goto LAB_0019c7f2;
                  if (lVar2 == LY_STMT_DEFAULT) goto LAB_0019cc85;
                }
                else {
                  if (lVar2 == LY_STMT_ENUM) {
LAB_0019c843:
                    LVar13 = lys_compile_type_enums
                                       (ctx,(lysp_type_enum *)*ppvVar16,
                                        (uint)(lVar2 == LY_STMT_ENUM) * 4 + LY_TYPE_BITS,
                                        (lysc_type_bitenum_item *)0x0,
                                        (lysc_type_bitenum_item **)when_c);
                    goto LAB_0019c80a;
                  }
                  if ((lVar2 == LY_STMT_DEVIATE) || (lVar2 == LY_STMT_DEVIATION)) goto LAB_0019cc85;
                }
              }
              else if ((int)lVar2 < 0xe0000) {
                if ((lVar2 == LY_STMT_ERROR_APP_TAG) || (lVar2 == LY_STMT_ERROR_MESSAGE))
                goto LAB_0019c7f2;
              }
              else {
                if (lVar2 == LY_STMT_EXTENSION_INSTANCE) {
                  plVar24 = (lysp_ext_instance *)*ppvVar16;
                  if (plVar24 == (lysp_ext_instance *)0x0) goto LAB_0019c80a;
                  plVar6 = *when_c;
                  if (plVar6 == (lysc_when *)0x0) {
                    plVar15 = (long *)calloc(1,(long)plVar24[-1].exts * 0x48 + 8);
                    if (plVar15 != (long *)0x0) {
                      lVar26 = 0;
                      goto LAB_0019c9b8;
                    }
                  }
                  else {
                    lVar26 = *(long *)&plVar6[-1].refcount;
                    plVar15 = (long *)realloc(&plVar6[-1].refcount,
                                              ((long)&(plVar24[-1].exts)->name + lVar26 * 2) * 0x48
                                              + 8);
                    if (plVar15 != (long *)0x0) {
                      when_c = (lysc_when **)plVar18->storage_p;
LAB_0019c9b8:
                      *when_c = (lysc_when *)(plVar15 + 1);
                      if (*plVar18->storage_p != (void *)0x0) {
                        memset((void *)((long)*plVar18->storage_p + *plVar15 * 0x48),0,
                               ((long)&(plVar24[-1].exts)->name + lVar26) * 0x48);
                      }
                      if (plVar24[-1].exts == (lysp_ext_instance *)0x0) goto LAB_0019c80a;
                      plVar23 = (lysp_ext_instance *)0x0;
                      extp_00 = plVar24;
                      do {
                        pvVar7 = *plVar18->storage_p;
                        lVar26 = *(long *)((long)pvVar7 + -8);
                        *(long *)((long)pvVar7 + -8) = lVar26 + 1;
                        LVar13 = lys_compile_ext(ctx,extp_00,
                                                 (lysc_ext_instance *)((long)pvVar7 + lVar26 * 0x48)
                                                 ,ext);
                        if (LVar13 != LY_SUCCESS) {
                          if (LVar13 != LY_ENOT) goto LAB_0019ccc3;
                          plVar15 = (long *)((long)*plVar18->storage_p + -8);
                          *plVar15 = *plVar15 + -1;
                        }
                        plVar23 = (lysp_ext_instance *)((long)&plVar23->name + 1);
                        extp_00 = extp_00 + 1;
                      } while (plVar23 < plVar24[-1].exts);
                      goto LAB_0019c813;
                    }
                  }
LAB_0019cba4:
                  LVar13 = LY_EMEM;
                  ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                         "lys_compile_ext_instance_stmt");
                  goto LAB_0019ccc3;
                }
                if ((lVar2 == LY_STMT_EXTENSION) || (lVar2 == LY_STMT_FEATURE)) goto LAB_0019cc85;
              }
LAB_0019cc5e:
              plVar20 = ctx->ctx;
              if (lVar2 == LY_STMT_EXTENSION_INSTANCE) {
                pcVar21 = "extension instance";
              }
              else {
                pcVar21 = lys_stmt_str(lVar2);
              }
              pcVar22 = ext->argument;
              pcVar8 = ", ";
              if (pcVar22 == (char *)0x0) {
                pcVar8 = "\t";
                pcVar22 = "";
              }
              ly_vlog(plVar20,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Statement \"%s\" is not supported as an extension (found in \"%s%s%s\") substatement."
                      ,pcVar21,ext->def->name,pcVar8 + 1,pcVar22);
            }
            else {
              if ((int)lVar2 < 0x210000) {
                if (0x19ffff < (int)lVar2) {
                  if (0x1dffff < (int)lVar2) {
                    if (lVar2 != LY_STMT_NAMESPACE) {
                      if (lVar2 == LY_STMT_ORDERED_BY) goto LAB_0019c6dd;
                      if (lVar2 != LY_STMT_ORGANIZATION) goto LAB_0019cc5e;
                    }
LAB_0019c7f2:
                    LVar13 = lydict_insert(ctx->ctx,(char *)*ppvVar16,0,(char **)when_c);
                    goto LAB_0019c80a;
                  }
                  if ((int)lVar2 < 0x1c0000) {
                    if (lVar2 == LY_STMT_MIN_ELEMENTS) {
LAB_0019c5f2:
                      *(undefined4 *)when_c = *(undefined4 *)ppvVar16;
                      goto LAB_0019c80a;
                    }
                    if (lVar2 == LY_STMT_MODIFIER) goto LAB_0019c7f2;
                  }
                  else {
                    if (lVar2 == LY_STMT_MUST) {
                      plVar5 = (lysp_restr *)*ppvVar16;
                      if (plVar5 == (lysp_restr *)0x0) goto LAB_0019c80a;
                      plVar6 = *when_c;
                      if (plVar6 == (lysc_when *)0x0) {
                        plVar15 = (long *)calloc(1,(long)plVar5[-1].exts * 0x38 + 8);
                        if (plVar15 == (long *)0x0) goto LAB_0019cba4;
                        lVar26 = 0;
                      }
                      else {
                        lVar26 = *(long *)&plVar6[-1].refcount;
                        plVar15 = (long *)realloc(&plVar6[-1].refcount,
                                                  ((long)&(plVar5[-1].exts)->name + lVar26 * 2) *
                                                  0x38 + 8);
                        if (plVar15 == (long *)0x0) goto LAB_0019cba4;
                        when_c = (lysc_when **)plVar18->storage_p;
                      }
                      *when_c = (lysc_when *)(plVar15 + 1);
                      if (*plVar18->storage_p != (void *)0x0) {
                        memset((void *)((long)*plVar18->storage_p + *plVar15 * 0x38),0,
                               ((long)&(plVar5[-1].exts)->name + lVar26) * 0x38);
                      }
                      if (plVar5[-1].exts == (lysp_ext_instance *)0x0) goto LAB_0019c80a;
                      plVar24 = (lysp_ext_instance *)0x0;
                      must_p = plVar5;
                      do {
                        pvVar7 = *plVar18->storage_p;
                        lVar26 = *(long *)((long)pvVar7 + -8);
                        *(long *)((long)pvVar7 + -8) = lVar26 + 1;
                        LVar13 = lys_compile_must(ctx,must_p,
                                                  (lysc_must *)(lVar26 * 0x38 + (long)pvVar7));
                        if (LVar13 != LY_SUCCESS) goto LAB_0019ccc3;
                        plVar24 = (lysp_ext_instance *)((long)&plVar24->name + 1);
                        must_p = must_p + 1;
                      } while (plVar24 < plVar5[-1].exts);
                      goto LAB_0019c813;
                    }
                    if (lVar2 == LY_STMT_MODULE) goto LAB_0019cc85;
                  }
                  goto LAB_0019cc5e;
                }
                if ((int)lVar2 < 0x170000) {
                  if ((int)lVar2 < 0x130000) {
                    if (lVar2 == LY_STMT_FRACTION_DIGITS) goto LAB_0019c875;
                    if (lVar2 == LY_STMT_IDENTITY) {
                      LVar13 = lys_identity_precompile
                                         (ctx,(ly_ctx *)0x0,(lysp_module *)0x0,
                                          (lysp_ident *)*ppvVar16,(lysc_ident **)when_c);
                      goto LAB_0019c80a;
                    }
                  }
                  else if ((int)lVar2 < 0x160000) {
                    if (((lVar2 == LY_STMT_IF_FEATURE) || (lVar2 == LY_STMT_IMPORT)) ||
                       (lVar2 == LY_STMT_INCLUDE)) goto LAB_0019cc85;
                  }
                  else if (lVar2 == LY_STMT_KEY) goto LAB_0019c7f2;
                  goto LAB_0019cc5e;
                }
                if (lVar2 == LY_STMT_LENGTH) {
                  lVar10 = '\x01';
LAB_0019c8ce:
                  LVar13 = lys_compile_type_range
                                     (ctx,(lysp_restr *)*ppvVar16,LY_TYPE_UINT64,lVar10,'\0',
                                      (lysc_range *)0x0,(lysc_range **)when_c);
                }
                else {
                  if (lVar2 != LY_STMT_MANDATORY) {
                    if (lVar2 == LY_STMT_MAX_ELEMENTS) goto LAB_0019c5f2;
                    goto LAB_0019cc5e;
                  }
LAB_0019c6dd:
                  *(ushort *)when_c = *(ushort *)ppvVar16;
                }
LAB_0019c80a:
                if (LVar13 == LY_SUCCESS) {
LAB_0019c813:
                  ly_set_add(&storagep_compiled,ppvVar16,'\x01',(uint32_t *)0x0);
                  goto LAB_0019c82f;
                }
                goto LAB_0019ccc3;
              }
              if ((int)lVar2 < 0x2a0000) {
                if ((int)lVar2 < 0x260000) {
                  if ((int)lVar2 < 0x230000) {
                    if (lVar2 == LY_STMT_PATTERN) {
                      LVar13 = lys_compile_type_patterns
                                         (ctx,(lysp_restr *)*ppvVar16,(lysc_pattern **)0x0,
                                          (lysc_pattern ***)when_c);
                      goto LAB_0019c80a;
                    }
                    if (lVar2 == LY_STMT_PATH) goto LAB_0019cc85;
                  }
                  else {
                    if (lVar2 == LY_STMT_POSITION) {
LAB_0019c505:
                      *when_c = (lysc_when *)*ppvVar16;
                      goto LAB_0019c80a;
                    }
                    if (lVar2 == LY_STMT_PRESENCE) goto LAB_0019c7f2;
                    if (lVar2 == LY_STMT_PREFIX) goto LAB_0019cc85;
                  }
                }
                else if ((int)lVar2 < 0x280000) {
                  if (lVar2 == LY_STMT_RANGE) {
                    lVar10 = '\0';
                    goto LAB_0019c8ce;
                  }
                  if (lVar2 == LY_STMT_REFERENCE) goto LAB_0019c7f2;
                }
                else {
                  if (lVar2 == LY_STMT_REQUIRE_INSTANCE) {
LAB_0019c875:
                    *(undefined1 *)when_c = *(undefined1 *)ppvVar16;
                    goto LAB_0019c80a;
                  }
                  if (lVar2 == LY_STMT_REFINE) goto LAB_0019cc85;
                }
                goto LAB_0019cc5e;
              }
              if (0x30ffff < (int)lVar2) {
                if ((int)lVar2 < 0x330000) {
                  if (lVar2 == LY_STMT_UNITS) goto LAB_0019c7f2;
                  if (lVar2 == LY_STMT_VALUE) goto LAB_0019c505;
                }
                else {
                  if (lVar2 == LY_STMT_WHEN) {
                    when_p = (lysp_when *)*ppvVar16;
                    lyplg_ext_get_storage_p(ext,0x2c0000,(void ***)&enabled);
                    if ((uint16_t *)CONCAT71(uStack_5f,enabled) == (uint16_t *)0x0) {
                      uVar11 = 0;
                    }
                    else {
                      uVar11 = *(uint16_t *)CONCAT71(uStack_5f,enabled);
                    }
                    LVar13 = lys_compile_when(ctx,when_p,uVar11,(lysc_node *)0x0,(lysc_node *)0x0,
                                              (lysc_node *)0x0,when_c);
                    goto LAB_0019c80a;
                  }
                  if ((lVar2 == LY_STMT_YANG_VERSION) || (lVar2 == LY_STMT_YIN_ELEMENT))
                  goto LAB_0019cc85;
                }
                goto LAB_0019cc5e;
              }
              if ((int)lVar2 < 0x2d0000) {
                if (lVar2 == LY_STMT_STATUS) goto LAB_0019c6dd;
                if ((lVar2 == LY_STMT_REVISION) || (lVar2 == LY_STMT_REVISION_DATE))
                goto LAB_0019cc85;
                goto LAB_0019cc5e;
              }
              if ((int)lVar2 < 0x2f0000) {
                if (lVar2 == LY_STMT_TYPE) {
                  type_p = (lysp_type *)*ppvVar16;
                  lyplg_ext_get_storage_p(ext,0x2c0000,(void ***)&enabled);
                  if ((uint16_t *)CONCAT71(uStack_5f,enabled) == (uint16_t *)0x0) {
                    uVar11 = 0;
                  }
                  else {
                    uVar11 = *(uint16_t *)CONCAT71(uStack_5f,enabled);
                  }
                  lyplg_ext_get_storage_p(ext,0x310000,(void ***)&enabled);
                  if ((undefined8 *)CONCAT71(uStack_5f,enabled) == (undefined8 *)0x0) {
                    local_38 = (char *)0x0;
                  }
                  else {
                    local_38 = *(char **)CONCAT71(uStack_5f,enabled);
                  }
                  LVar13 = lys_compile_type(ctx,(lysp_node *)0x0,uVar11,ext->def->name,type_p,
                                            (lysc_type **)when_c,&local_38,(lysp_qname **)0x0);
                  if (LVar13 == LY_SUCCESS) {
                    LOCK();
                    piVar1 = (int *)((long)*plVar18->storage_p + 0x1c);
                    *piVar1 = *piVar1 + 1;
                    UNLOCK();
                  }
                  goto LAB_0019c80a;
                }
                if (lVar2 == LY_STMT_SUBMODULE) goto LAB_0019cc85;
                goto LAB_0019cc5e;
              }
              if ((lVar2 != LY_STMT_TYPEDEF) && (lVar2 != LY_STMT_UNIQUE)) goto LAB_0019cc5e;
LAB_0019cc85:
              plVar20 = ctx->ctx;
              if (lVar2 == LY_STMT_EXTENSION_INSTANCE) {
                pcVar21 = "extension instance";
              }
              else {
                pcVar21 = lys_stmt_str(lVar2);
              }
              ly_vlog(plVar20,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Statement \"%s\" compilation is not supported.",pcVar21);
            }
            LVar13 = LY_EVALID;
            goto LAB_0019ccc3;
          }
        }
LAB_0019c82f:
        ppvVar27 = (void **)((long)ppvVar27 + 1);
      }
      LVar13 = LY_SUCCESS;
LAB_0019ccc3:
      ctx->ext = (lysc_ext_instance *)0x0;
      ly_set_erase(&storagep_compiled,(_func_void_void_ptr *)0x0);
      return LVar13;
    }
    plVar20 = ctx->ctx;
    pcVar21 = "ext";
  }
  ly_log(plVar20,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar21,
         "lyplg_ext_compile_extension_instance");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_ext_compile_extension_instance(struct lysc_ctx *ctx, const struct lysp_ext_instance *extp,
        struct lysc_ext_instance *ext)
{
    LY_ERR rc = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u, v;
    enum ly_stmt stmtp;
    void **storagep;
    struct ly_set storagep_compiled = {0};

    LY_CHECK_ARG_RET(ctx ? ctx->ctx : NULL, ctx, extp, ext, LY_EINVAL);

    /* note into the compile context that we are processing extension now */
    ctx->ext = ext;

    LY_ARRAY_FOR(extp->substmts, u) {
        stmtp = extp->substmts[u].stmt;
        storagep = extp->substmts[u].storage_p;

        if (!*storagep || ly_set_contains(&storagep_compiled, storagep, NULL)) {
            /* nothing parsed or already compiled (for example, if it is a linked list of parsed nodes) */
            continue;
        }

        LY_ARRAY_FOR(ext->substmts, v) {
            if (stmtp != ext->substmts[v].stmt) {
                continue;
            }

            if ((rc = lys_compile_ext_instance_stmt(ctx, storagep, ext, &ext->substmts[v]))) {
                goto cleanup;
            }

            /* parsed substatement compiled */
            break;
        }

        /* compiled */
        ly_set_add(&storagep_compiled, storagep, 1, NULL);
    }

cleanup:
    ctx->ext = NULL;
    ly_set_erase(&storagep_compiled, NULL);
    return rc;
}